

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void rune_xtra_act(keypress ch,wchar_t oid)

{
  uint32_t *puVar1;
  _Bool _Var2;
  quark_t qVar3;
  char *pcVar4;
  size_t i;
  char note_text [80];
  
  if (ch._0_8_ >> 0x20 == 0x7b) {
    note_text[0x40] = '\0';
    note_text[0x41] = '\0';
    note_text[0x42] = '\0';
    note_text[0x43] = '\0';
    note_text[0x44] = '\0';
    note_text[0x45] = '\0';
    note_text[0x46] = '\0';
    note_text[0x47] = '\0';
    note_text[0x48] = '\0';
    note_text[0x49] = '\0';
    note_text[0x4a] = '\0';
    note_text[0x4b] = '\0';
    note_text[0x4c] = '\0';
    note_text[0x4d] = '\0';
    note_text[0x4e] = '\0';
    note_text[0x4f] = '\0';
    note_text[0x30] = '\0';
    note_text[0x31] = '\0';
    note_text[0x32] = '\0';
    note_text[0x33] = '\0';
    note_text[0x34] = '\0';
    note_text[0x35] = '\0';
    note_text[0x36] = '\0';
    note_text[0x37] = '\0';
    note_text[0x38] = '\0';
    note_text[0x39] = '\0';
    note_text[0x3a] = '\0';
    note_text[0x3b] = '\0';
    note_text[0x3c] = '\0';
    note_text[0x3d] = '\0';
    note_text[0x3e] = '\0';
    note_text[0x3f] = '\0';
    note_text[0x20] = '\0';
    note_text[0x21] = '\0';
    note_text[0x22] = '\0';
    note_text[0x23] = '\0';
    note_text[0x24] = '\0';
    note_text[0x25] = '\0';
    note_text[0x26] = '\0';
    note_text[0x27] = '\0';
    note_text[0x28] = '\0';
    note_text[0x29] = '\0';
    note_text[0x2a] = '\0';
    note_text[0x2b] = '\0';
    note_text[0x2c] = '\0';
    note_text[0x2d] = '\0';
    note_text[0x2e] = '\0';
    note_text[0x2f] = '\0';
    note_text[0x10] = '\0';
    note_text[0x11] = '\0';
    note_text[0x12] = '\0';
    note_text[0x13] = '\0';
    note_text[0x14] = '\0';
    note_text[0x15] = '\0';
    note_text[0x16] = '\0';
    note_text[0x17] = '\0';
    note_text[0x18] = '\0';
    note_text[0x19] = '\0';
    note_text[0x1a] = '\0';
    note_text[0x1b] = '\0';
    note_text[0x1c] = '\0';
    note_text[0x1d] = '\0';
    note_text[0x1e] = '\0';
    note_text[0x1f] = '\0';
    note_text[0] = '\0';
    note_text[1] = '\0';
    note_text[2] = '\0';
    note_text[3] = '\0';
    note_text[4] = '\0';
    note_text[5] = '\0';
    note_text[6] = '\0';
    note_text[7] = '\0';
    note_text[8] = '\0';
    note_text[9] = '\0';
    note_text[10] = '\0';
    note_text[0xb] = '\0';
    note_text[0xc] = '\0';
    note_text[0xd] = '\0';
    note_text[0xe] = '\0';
    note_text[0xf] = '\0';
    screen_save();
    prt("Inscribe with: ",L'\0',L'\0');
    i = (size_t)oid;
    qVar3 = rune_note(i);
    if (qVar3 != 0) {
      qVar3 = rune_note(i);
      pcVar4 = quark_str(qVar3);
      strnfmt(note_text,0x50,"%s",pcVar4);
    }
    _Var2 = askfor_aux(note_text,0x50,
                       (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
    if (_Var2) {
      qVar3 = rune_note(i);
      if (qVar3 != 0) {
        rune_set_note(i,(char *)0x0);
      }
      rune_set_note(i,note_text);
      rune_autoinscribe(player,oid);
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x60000;
    }
    screen_load();
  }
  else if (ch.code == 0x7d) {
    rune_set_note((long)oid,(char *)0x0);
    return;
  }
  return;
}

Assistant:

static void rune_xtra_act(struct keypress ch, int oid)
{
	/* Uninscribe */
	if (ch.code == '}') {
		rune_set_note(oid, NULL);
	} else if (ch.code == '{') {
		/* Inscribe */
		char note_text[80] = "";

		/* Avoid the prompt getting in the way */
		screen_save();

		/* Prompt */
		prt("Inscribe with: ", 0, 0);

		/* Default note */
		if (rune_note(oid))
			strnfmt(note_text, sizeof(note_text), "%s",
					quark_str(rune_note(oid)));

		/* Get an inscription */
		if (askfor_aux(note_text, sizeof(note_text), NULL)) {
			/* Remove old inscription if existent */
			if (rune_note(oid))
				rune_set_note(oid, NULL);

			/* Add the autoinscription */
			rune_set_note(oid, note_text);
			rune_autoinscribe(player, oid);

			/* Redraw gear */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
		}

		/* Reload the screen */
		screen_load();
	}
}